

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::XThreadFulfiller<void>::fulfill(XThreadFulfiller<void> *this,FixVoid<void> *value)

{
  bool bVar1;
  Void *value_00;
  XThreadPafImpl<void> *pXVar2;
  ExceptionOr<kj::_::Void> local_1c0;
  FulfillScope local_20;
  FulfillScope scope;
  FixVoid<void> *value_local;
  XThreadFulfiller<void> *this_local;
  
  scope.obj = (XThreadPaf *)value;
  XThreadPaf::FulfillScope::FulfillScope(&local_20,&this->target);
  bVar1 = XThreadPaf::FulfillScope::shouldFulfill(&local_20);
  if (bVar1) {
    value_00 = mv<kj::_::Void>((Void *)scope.obj);
    ExceptionOr<kj::_::Void>::ExceptionOr(&local_1c0,value_00);
    pXVar2 = XThreadPaf::FulfillScope::getTarget<void>(&local_20);
    ExceptionOr<kj::_::Void>::operator=(&pXVar2->result,&local_1c0);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_1c0);
  }
  XThreadPaf::FulfillScope::~FulfillScope(&local_20);
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) const override {
    XThreadPaf::FulfillScope scope(&target);
    if (scope.shouldFulfill()) {
      scope.getTarget<T>()->result = kj::mv(value);
    }
  }